

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceMatrixDecomposition.cpp
# Opt level: O3

void __thiscall
OpenMD::ForceMatrixDecomposition::fillInteractionData
          (ForceMatrixDecomposition *this,InteractionData *idat,int atom1,int atom2,bool newAtom1)

{
  int iVar1;
  uint uVar2;
  pointer piVar3;
  pointer pSVar4;
  pointer pVVar5;
  pointer pdVar6;
  int iVar7;
  pointer pVVar8;
  double (*padVar9) [3];
  RotMat3x3d *pRVar10;
  Mat3x3d *pMVar11;
  undefined7 in_register_00000081;
  uint i;
  long lVar12;
  uint j;
  long lVar13;
  
  iVar7 = (*(this->super_ForceDecomposition)._vptr_ForceDecomposition[0x1e])
                    (this,(ulong)(uint)atom1,(ulong)(uint)atom2);
  idat->excluded = SUB41(iVar7,0);
  piVar3 = (this->super_ForceDecomposition).idents.super__Vector_base<int,_std::allocator<int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((int)CONCAT71(in_register_00000081,newAtom1) == 0) {
    idat->atid2 = piVar3[atom2];
    piVar3 = (this->super_ForceDecomposition).regions.super__Vector_base<int,_std::allocator<int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    iVar7 = piVar3[atom1];
    if ((iVar7 < 0) || (iVar1 = piVar3[atom2], iVar1 < 0)) {
      idat->sameRegion = false;
    }
    else {
      idat->sameRegion = iVar7 == iVar1;
    }
    uVar2 = (this->super_ForceDecomposition).atomStorageLayout_;
    if ((uVar2 & 8) != 0) {
      padVar9 = (double (*) [3])
                ((((this->super_ForceDecomposition).snap_)->atomData).aMat.
                 super__Vector_base<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + atom2);
      pRVar10 = &idat->A2;
      if (pRVar10 != (RotMat3x3d *)padVar9) {
        lVar12 = 0;
        do {
          lVar13 = 0;
          do {
            (pRVar10->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0]
            [lVar13] = (((SquareMatrix<double,_3> *)*padVar9)->super_RectMatrix<double,_3U,_3U>).
                       data_[0][lVar13];
            lVar13 = lVar13 + 1;
          } while (lVar13 != 3);
          lVar12 = lVar12 + 1;
          pRVar10 = (RotMat3x3d *)
                    ((pRVar10->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_
                    + 1);
          padVar9 = padVar9 + 1;
        } while (lVar12 != 3);
      }
    }
    if ((uVar2 & 0x20) != 0) {
      pVVar8 = (((this->super_ForceDecomposition).snap_)->atomData).torque.
               super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
               ._M_impl.super__Vector_impl_data._M_start + atom2;
      if (&idat->t2 != pVVar8) {
        lVar12 = 0;
        do {
          (idat->t2).super_Vector<double,_3U>.data_[lVar12] =
               (pVVar8->super_Vector<double,_3U>).data_[lVar12];
          lVar12 = lVar12 + 1;
        } while (lVar12 != 3);
      }
    }
    if ((uVar2 >> 10 & 1) != 0) {
      pVVar8 = (((this->super_ForceDecomposition).snap_)->atomData).dipole.
               super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
               ._M_impl.super__Vector_impl_data._M_start + atom2;
      if (&idat->D_2 != pVVar8) {
        lVar12 = 0;
        do {
          (idat->D_2).super_Vector<double,_3U>.data_[lVar12] =
               (pVVar8->super_Vector<double,_3U>).data_[lVar12];
          lVar12 = lVar12 + 1;
        } while (lVar12 != 3);
      }
    }
    if ((uVar2 >> 0xb & 1) != 0) {
      padVar9 = (double (*) [3])
                ((((this->super_ForceDecomposition).snap_)->atomData).quadrupole.
                 super__Vector_base<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + atom2);
      pMVar11 = &idat->Q_2;
      if (pMVar11 != (Mat3x3d *)padVar9) {
        lVar12 = 0;
        do {
          lVar13 = 0;
          do {
            (pMVar11->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0]
            [lVar13] = (((SquareMatrix<double,_3> *)*padVar9)->super_RectMatrix<double,_3U,_3U>).
                       data_[0][lVar13];
            lVar13 = lVar13 + 1;
          } while (lVar13 != 3);
          lVar12 = lVar12 + 1;
          pMVar11 = (Mat3x3d *)
                    ((pMVar11->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_
                    + 1);
          padVar9 = padVar9 + 1;
        } while (lVar12 != 3);
      }
    }
    if ((char)uVar2 < '\0') {
      idat->rho2 = (((this->super_ForceDecomposition).snap_)->atomData).density.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[atom2];
    }
    if ((uVar2 >> 8 & 1) != 0) {
      idat->frho2 = (((this->super_ForceDecomposition).snap_)->atomData).functional.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[atom2];
    }
    if ((uVar2 >> 9 & 1) != 0) {
      idat->dfrho2 = (((this->super_ForceDecomposition).snap_)->atomData).functionalDerivative.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[atom2];
    }
    if ((uVar2 & 0x40) != 0) {
      idat->particlePot2 =
           (((this->super_ForceDecomposition).snap_)->atomData).particlePot.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start[atom2];
    }
    if ((uVar2 >> 0xd & 1) != 0) {
      idat->skippedCharge2 =
           (((this->super_ForceDecomposition).snap_)->atomData).skippedCharge.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start[atom2];
    }
    if ((uVar2 >> 0xe & 1) == 0) {
      return;
    }
    pdVar6 = (((this->super_ForceDecomposition).snap_)->atomData).flucQPos.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
  }
  else {
    idat->atid1 = piVar3[atom1];
    idat->atid2 = piVar3[atom2];
    piVar3 = (this->super_ForceDecomposition).regions.super__Vector_base<int,_std::allocator<int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    iVar7 = piVar3[atom1];
    if ((iVar7 < 0) || (iVar1 = piVar3[atom2], iVar1 < 0)) {
      idat->sameRegion = false;
    }
    else {
      idat->sameRegion = iVar7 == iVar1;
    }
    uVar2 = (this->super_ForceDecomposition).atomStorageLayout_;
    if ((uVar2 & 8) != 0) {
      pSVar4 = (((this->super_ForceDecomposition).snap_)->atomData).aMat.
               super__Vector_base<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      padVar9 = (double (*) [3])(pSVar4 + atom1);
      pRVar10 = &idat->A1;
      if (pRVar10 != (RotMat3x3d *)padVar9) {
        lVar12 = 0;
        do {
          lVar13 = 0;
          do {
            (pRVar10->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0]
            [lVar13] = (((SquareMatrix<double,_3> *)*padVar9)->super_RectMatrix<double,_3U,_3U>).
                       data_[0][lVar13];
            lVar13 = lVar13 + 1;
          } while (lVar13 != 3);
          lVar12 = lVar12 + 1;
          pRVar10 = (RotMat3x3d *)
                    ((pRVar10->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_
                    + 1);
          padVar9 = padVar9 + 1;
        } while (lVar12 != 3);
      }
      padVar9 = (double (*) [3])(pSVar4 + atom2);
      pRVar10 = &idat->A2;
      if (pRVar10 != (RotMat3x3d *)padVar9) {
        lVar12 = 0;
        do {
          lVar13 = 0;
          do {
            (pRVar10->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0]
            [lVar13] = (((SquareMatrix<double,_3> *)*padVar9)->super_RectMatrix<double,_3U,_3U>).
                       data_[0][lVar13];
            lVar13 = lVar13 + 1;
          } while (lVar13 != 3);
          lVar12 = lVar12 + 1;
          pRVar10 = (RotMat3x3d *)
                    ((pRVar10->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_
                    + 1);
          padVar9 = padVar9 + 1;
        } while (lVar12 != 3);
      }
    }
    if ((uVar2 & 0x20) != 0) {
      pVVar5 = (((this->super_ForceDecomposition).snap_)->atomData).torque.
               super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pVVar8 = pVVar5 + atom1;
      if (&idat->t1 != pVVar8) {
        lVar12 = 0;
        do {
          (idat->t1).super_Vector<double,_3U>.data_[lVar12] =
               (pVVar8->super_Vector<double,_3U>).data_[lVar12];
          lVar12 = lVar12 + 1;
        } while (lVar12 != 3);
      }
      pVVar5 = pVVar5 + atom2;
      if (&idat->t2 != pVVar5) {
        lVar12 = 0;
        do {
          (idat->t2).super_Vector<double,_3U>.data_[lVar12] =
               (pVVar5->super_Vector<double,_3U>).data_[lVar12];
          lVar12 = lVar12 + 1;
        } while (lVar12 != 3);
      }
    }
    if ((uVar2 >> 10 & 1) != 0) {
      pVVar5 = (((this->super_ForceDecomposition).snap_)->atomData).dipole.
               super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pVVar8 = pVVar5 + atom1;
      if (&idat->D_1 != pVVar8) {
        lVar12 = 0;
        do {
          (idat->D_1).super_Vector<double,_3U>.data_[lVar12] =
               (pVVar8->super_Vector<double,_3U>).data_[lVar12];
          lVar12 = lVar12 + 1;
        } while (lVar12 != 3);
      }
      pVVar5 = pVVar5 + atom2;
      if (&idat->D_2 != pVVar5) {
        lVar12 = 0;
        do {
          (idat->D_2).super_Vector<double,_3U>.data_[lVar12] =
               (pVVar5->super_Vector<double,_3U>).data_[lVar12];
          lVar12 = lVar12 + 1;
        } while (lVar12 != 3);
      }
    }
    if ((uVar2 >> 0xb & 1) != 0) {
      pSVar4 = (((this->super_ForceDecomposition).snap_)->atomData).quadrupole.
               super__Vector_base<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      padVar9 = (double (*) [3])(pSVar4 + atom1);
      pMVar11 = &idat->Q_1;
      if (pMVar11 != (Mat3x3d *)padVar9) {
        lVar12 = 0;
        do {
          lVar13 = 0;
          do {
            (pMVar11->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0]
            [lVar13] = (((SquareMatrix<double,_3> *)*padVar9)->super_RectMatrix<double,_3U,_3U>).
                       data_[0][lVar13];
            lVar13 = lVar13 + 1;
          } while (lVar13 != 3);
          lVar12 = lVar12 + 1;
          pMVar11 = (Mat3x3d *)
                    ((pMVar11->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_
                    + 1);
          padVar9 = padVar9 + 1;
        } while (lVar12 != 3);
      }
      padVar9 = (double (*) [3])(pSVar4 + atom2);
      pMVar11 = &idat->Q_2;
      if (pMVar11 != (Mat3x3d *)padVar9) {
        lVar12 = 0;
        do {
          lVar13 = 0;
          do {
            (pMVar11->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0]
            [lVar13] = (((SquareMatrix<double,_3> *)*padVar9)->super_RectMatrix<double,_3U,_3U>).
                       data_[0][lVar13];
            lVar13 = lVar13 + 1;
          } while (lVar13 != 3);
          lVar12 = lVar12 + 1;
          pMVar11 = (Mat3x3d *)
                    ((pMVar11->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_
                    + 1);
          padVar9 = padVar9 + 1;
        } while (lVar12 != 3);
      }
    }
    if ((char)uVar2 < '\0') {
      pdVar6 = (((this->super_ForceDecomposition).snap_)->atomData).density.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      idat->rho1 = pdVar6[atom1];
      idat->rho2 = pdVar6[atom2];
    }
    if ((uVar2 >> 8 & 1) != 0) {
      pdVar6 = (((this->super_ForceDecomposition).snap_)->atomData).functional.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      idat->frho1 = pdVar6[atom1];
      idat->frho2 = pdVar6[atom2];
    }
    if ((uVar2 >> 9 & 1) != 0) {
      pdVar6 = (((this->super_ForceDecomposition).snap_)->atomData).functionalDerivative.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      idat->dfrho1 = pdVar6[atom1];
      idat->dfrho2 = pdVar6[atom2];
    }
    if ((uVar2 & 0x40) != 0) {
      pdVar6 = (((this->super_ForceDecomposition).snap_)->atomData).particlePot.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      idat->particlePot1 = pdVar6[atom1];
      idat->particlePot2 = pdVar6[atom2];
    }
    if ((uVar2 >> 0xd & 1) != 0) {
      pdVar6 = (((this->super_ForceDecomposition).snap_)->atomData).skippedCharge.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      idat->skippedCharge1 = pdVar6[atom1];
      idat->skippedCharge2 = pdVar6[atom2];
    }
    if ((uVar2 >> 0xe & 1) == 0) {
      return;
    }
    pdVar6 = (((this->super_ForceDecomposition).snap_)->atomData).flucQPos.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    idat->flucQ1 = pdVar6[atom1];
  }
  idat->flucQ2 = pdVar6[atom2];
  return;
}

Assistant:

void ForceMatrixDecomposition::fillInteractionData(InteractionData& idat,
                                                     int atom1, int atom2,
                                                     bool newAtom1) {
    idat.excluded = excludeAtomPair(atom1, atom2);

    if (newAtom1) {
#ifdef IS_MPI
      idat.atid1 = identsRow[atom1];
      idat.atid2 = identsCol[atom2];

      if (regionsRow[atom1] >= 0 && regionsCol[atom2] >= 0) {
        idat.sameRegion = (regionsRow[atom1] == regionsCol[atom2]);
      } else {
        idat.sameRegion = false;
      }

      if (atomStorageLayout_ & DataStorage::dslAmat) {
        idat.A1 = atomRowData.aMat[atom1];
        idat.A2 = atomColData.aMat[atom2];
      }

      if (atomStorageLayout_ & DataStorage::dslTorque) {
        idat.t1 = atomRowData.torque[atom1];
        idat.t2 = atomColData.torque[atom2];
      }

      if (atomStorageLayout_ & DataStorage::dslDipole) {
        idat.D_1 = atomRowData.dipole[atom1];
        idat.D_2 = atomColData.dipole[atom2];
      }

      if (atomStorageLayout_ & DataStorage::dslQuadrupole) {
        idat.Q_1 = atomRowData.quadrupole[atom1];
        idat.Q_2 = atomColData.quadrupole[atom2];
      }

      if (atomStorageLayout_ & DataStorage::dslDensity) {
        idat.rho1 = atomRowData.density[atom1];
        idat.rho2 = atomColData.density[atom2];
      }

      if (atomStorageLayout_ & DataStorage::dslFunctional) {
        idat.frho1 = atomRowData.functional[atom1];
        idat.frho2 = atomColData.functional[atom2];
      }

      if (atomStorageLayout_ & DataStorage::dslFunctionalDerivative) {
        idat.dfrho1 = atomRowData.functionalDerivative[atom1];
        idat.dfrho2 = atomColData.functionalDerivative[atom2];
      }

      if (atomStorageLayout_ & DataStorage::dslParticlePot) {
        idat.particlePot1 = atomRowData.particlePot[atom1];
        idat.particlePot2 = atomColData.particlePot[atom2];
      }

      if (atomStorageLayout_ & DataStorage::dslSkippedCharge) {
        idat.skippedCharge1 = atomRowData.skippedCharge[atom1];
        idat.skippedCharge2 = atomColData.skippedCharge[atom2];
      }

      if (atomStorageLayout_ & DataStorage::dslFlucQPosition) {
        idat.flucQ1 = atomRowData.flucQPos[atom1];
        idat.flucQ2 = atomColData.flucQPos[atom2];
      }

#else

      idat.atid1 = idents[atom1];
      idat.atid2 = idents[atom2];

      if (regions[atom1] >= 0 && regions[atom2] >= 0) {
        idat.sameRegion = (regions[atom1] == regions[atom2]);
      } else {
        idat.sameRegion = false;
      }

      if (atomStorageLayout_ & DataStorage::dslAmat) {
        idat.A1 = snap_->atomData.aMat[atom1];
        idat.A2 = snap_->atomData.aMat[atom2];
      }

      if (atomStorageLayout_ & DataStorage::dslTorque) {
        idat.t1 = snap_->atomData.torque[atom1];
        idat.t2 = snap_->atomData.torque[atom2];
      }

      if (atomStorageLayout_ & DataStorage::dslDipole) {
        idat.D_1 = snap_->atomData.dipole[atom1];
        idat.D_2 = snap_->atomData.dipole[atom2];
      }

      if (atomStorageLayout_ & DataStorage::dslQuadrupole) {
        idat.Q_1 = snap_->atomData.quadrupole[atom1];
        idat.Q_2 = snap_->atomData.quadrupole[atom2];
      }

      if (atomStorageLayout_ & DataStorage::dslDensity) {
        idat.rho1 = snap_->atomData.density[atom1];
        idat.rho2 = snap_->atomData.density[atom2];
      }

      if (atomStorageLayout_ & DataStorage::dslFunctional) {
        idat.frho1 = snap_->atomData.functional[atom1];
        idat.frho2 = snap_->atomData.functional[atom2];
      }

      if (atomStorageLayout_ & DataStorage::dslFunctionalDerivative) {
        idat.dfrho1 = snap_->atomData.functionalDerivative[atom1];
        idat.dfrho2 = snap_->atomData.functionalDerivative[atom2];
      }

      if (atomStorageLayout_ & DataStorage::dslParticlePot) {
        idat.particlePot1 = snap_->atomData.particlePot[atom1];
        idat.particlePot2 = snap_->atomData.particlePot[atom2];
      }

      if (atomStorageLayout_ & DataStorage::dslSkippedCharge) {
        idat.skippedCharge1 = snap_->atomData.skippedCharge[atom1];
        idat.skippedCharge2 = snap_->atomData.skippedCharge[atom2];
      }

      if (atomStorageLayout_ & DataStorage::dslFlucQPosition) {
        idat.flucQ1 = snap_->atomData.flucQPos[atom1];
        idat.flucQ2 = snap_->atomData.flucQPos[atom2];
      }
#endif

    } else {
      // atom1 is not new, so don't bother updating properties of that atom:
#ifdef IS_MPI
      idat.atid2 = identsCol[atom2];

      if (regionsRow[atom1] >= 0 && regionsCol[atom2] >= 0) {
        idat.sameRegion = (regionsRow[atom1] == regionsCol[atom2]);
      } else {
        idat.sameRegion = false;
      }

      if (atomStorageLayout_ & DataStorage::dslAmat) {
        idat.A2 = atomColData.aMat[atom2];
      }

      if (atomStorageLayout_ & DataStorage::dslTorque) {
        idat.t2 = atomColData.torque[atom2];
      }

      if (atomStorageLayout_ & DataStorage::dslDipole) {
        idat.D_2 = atomColData.dipole[atom2];
      }

      if (atomStorageLayout_ & DataStorage::dslQuadrupole) {
        idat.Q_2 = atomColData.quadrupole[atom2];
      }

      if (atomStorageLayout_ & DataStorage::dslDensity) {
        idat.rho2 = atomColData.density[atom2];
      }

      if (atomStorageLayout_ & DataStorage::dslFunctional) {
        idat.frho2 = atomColData.functional[atom2];
      }

      if (atomStorageLayout_ & DataStorage::dslFunctionalDerivative) {
        idat.dfrho2 = atomColData.functionalDerivative[atom2];
      }

      if (atomStorageLayout_ & DataStorage::dslParticlePot) {
        idat.particlePot2 = atomColData.particlePot[atom2];
      }

      if (atomStorageLayout_ & DataStorage::dslSkippedCharge) {
        idat.skippedCharge2 = atomColData.skippedCharge[atom2];
      }

      if (atomStorageLayout_ & DataStorage::dslFlucQPosition) {
        idat.flucQ2 = atomColData.flucQPos[atom2];
      }

#else
      idat.atid2 = idents[atom2];

      if (regions[atom1] >= 0 && regions[atom2] >= 0) {
        idat.sameRegion = (regions[atom1] == regions[atom2]);
      } else {
        idat.sameRegion = false;
      }

      if (atomStorageLayout_ & DataStorage::dslAmat) {
        idat.A2 = snap_->atomData.aMat[atom2];
      }

      if (atomStorageLayout_ & DataStorage::dslTorque) {
        idat.t2 = snap_->atomData.torque[atom2];
      }

      if (atomStorageLayout_ & DataStorage::dslDipole) {
        idat.D_2 = snap_->atomData.dipole[atom2];
      }

      if (atomStorageLayout_ & DataStorage::dslQuadrupole) {
        idat.Q_2 = snap_->atomData.quadrupole[atom2];
      }

      if (atomStorageLayout_ & DataStorage::dslDensity) {
        idat.rho2 = snap_->atomData.density[atom2];
      }

      if (atomStorageLayout_ & DataStorage::dslFunctional) {
        idat.frho2 = snap_->atomData.functional[atom2];
      }

      if (atomStorageLayout_ & DataStorage::dslFunctionalDerivative) {
        idat.dfrho2 = snap_->atomData.functionalDerivative[atom2];
      }

      if (atomStorageLayout_ & DataStorage::dslParticlePot) {
        idat.particlePot2 = snap_->atomData.particlePot[atom2];
      }

      if (atomStorageLayout_ & DataStorage::dslSkippedCharge) {
        idat.skippedCharge2 = snap_->atomData.skippedCharge[atom2];
      }

      if (atomStorageLayout_ & DataStorage::dslFlucQPosition) {
        idat.flucQ2 = snap_->atomData.flucQPos[atom2];
      }

#endif
    }
  }